

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void drawImage4(Array2D<Imf_3_2::Rgba> *px,int w,int h,int xMin,int xMax,int yMin,int yMax,
               int xLevel,int yLevel)

{
  int ySamples;
  int xSamples;
  
  xSamples = 1 << ((byte)xLevel & 0x1f);
  ySamples = 1 << ((byte)yLevel & 0x1f);
  anon_unknown.dwarf_109f::mndl<Imf_3_2::Rgba>
            ((anon_unknown_dwarf_109f *)px->_sizeY,(Array2D<Imf_3_2::Rgba> *)px->_data,w,h,xMin,xMax
             ,yMin,yMax,xSamples,ySamples,0.3247,0.33348,0.4346,(double)ySamples / (double)xSamples,
             0.4,-0.765);
  return;
}

Assistant:

void
drawImage4 (
    Array2D<Rgba>& px,
    int            w,
    int            h,
    int            xMin,
    int            xMax,
    int            yMin,
    int            yMax,
    int            xLevel,
    int            yLevel)
{
    mndl (
        px,
        w,
        h,
        xMin,
        xMax,
        yMin,
        yMax,
        (1 << xLevel),
        (1 << yLevel),
        0.3247,
        0.33348,
        0.4346,
        double (1 << yLevel) / double (1 << xLevel),
        0.4,
        -0.765);
}